

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapterbase.h
# Opt level: O0

void __thiscall bgui::ImageAdapterBase::ImageAdapterBase(ImageAdapterBase *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ImageAdapterBase_001c5058;
  gmath::SMatrix<long,_2,_3>::SMatrix((SMatrix<long,_2,_3> *)(in_RDI + 3));
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[9] = 0x3ff0000000000000;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0x406fe00000000000;
  in_RDI[0xc] = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  return;
}

Assistant:

ImageAdapterBase()
    {
      channel=-1;
      rotation=0;
      flip=false;
      scale=1;
      imin=0;
      imax=255;
      gamma=1;
      map=map_raw;
    }